

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

ArchKind __thiscall llvm::AArch64::parseArch(AArch64 *this,StringRef Arch)

{
  uint uVar1;
  iterator pcVar2;
  bool bVar3;
  StringRef Arch_00;
  StringRef SVar4;
  StringRef local_110;
  undefined1 local_100 [8];
  ArchNames<llvm::AArch64::ArchKind> A;
  ArchNames<llvm::AArch64::ArchKind> *__end1;
  ArchNames<llvm::AArch64::ArchKind> *__begin1;
  ArchNames<llvm::AArch64::ArchKind> (*__range1) [6];
  char *local_98;
  StringRef Syn;
  AArch64 *local_68;
  StringRef Arch_local;
  int local_c;
  
  SVar4.Length = (size_t)Arch.Data;
  SVar4.Data = (char *)this;
  SVar4 = getCanonicalArchName(SVar4);
  Arch_00.Length = (char *)SVar4.Length;
  local_68 = (AArch64 *)SVar4.Data;
  Arch_00.Data = Arch_00.Length;
  uVar1 = checkArchVersion(local_68,Arch_00);
  if (7 < uVar1) {
    SVar4 = getArchSynonym(SVar4);
    A._56_8_ = &(anonymous_namespace)::AArch64CPUNames;
    for (__end1 = (ArchNames<llvm::AArch64::ArchKind> *)(anonymous_namespace)::AArch64ARCHNames;
        __end1 != (ArchNames<llvm::AArch64::ArchKind> *)A._56_8_; __end1 = __end1 + 1) {
      memcpy(local_100,__end1,0x40);
      local_110 = anon_unknown.dwarf_2b9344::ArchNames<llvm::AArch64::ArchKind>::getName
                            ((ArchNames<llvm::AArch64::ArchKind> *)local_100);
      local_98 = SVar4.Data;
      Syn.Data = (char *)SVar4.Length;
      bVar3 = false;
      if (Syn.Data <= local_110.Length) {
        pcVar2 = StringRef::end(&local_110);
        if (Syn.Data == (char *)0x0) {
          local_c = 0;
        }
        else {
          local_c = memcmp(pcVar2 + -(long)Syn.Data,local_98,(size_t)Syn.Data);
        }
        bVar3 = local_c == 0;
      }
      if (bVar3) {
        return A.DefaultFPU;
      }
    }
  }
  return INVALID;
}

Assistant:

AArch64::ArchKind AArch64::parseArch(StringRef Arch) {
  Arch = getCanonicalArchName(Arch);
  if (checkArchVersion(Arch) < 8)
    return ArchKind::INVALID;

  StringRef Syn = getArchSynonym(Arch);
  for (const auto A : AArch64ARCHNames) {
    if (A.getName().endswith(Syn))
      return A.ID;
  }
  return ArchKind::INVALID;
}